

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::BranchLayerParams::ByteSizeLong(BranchLayerParams *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->ifbranch_ == (NeuralNetwork *)0x0 ||
      this == (BranchLayerParams *)&_BranchLayerParams_default_instance_) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetwork>(this->ifbranch_);
    sVar1 = sVar1 + 1;
  }
  if (this->elsebranch_ != (NeuralNetwork *)0x0 &&
      this != (BranchLayerParams *)&_BranchLayerParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetwork>(this->elsebranch_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t BranchLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BranchLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.NeuralNetwork ifBranch = 1;
  if (this->has_ifbranch()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->ifbranch_);
  }

  // .CoreML.Specification.NeuralNetwork elseBranch = 2;
  if (this->has_elsebranch()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->elsebranch_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}